

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O2

Pla_Man_t * Pla_ReadPla(char *pFileName)

{
  int iVar1;
  char *pBuffer;
  Vec_Str_t *p;
  Pla_Man_t *p_00;
  char *pcVar2;
  size_t sVar3;
  word Fill;
  word Fill_00;
  int Type;
  int local_4c;
  int nOuts;
  int nIns;
  Vec_Str_t *local_40;
  char *pLimit;
  
  pBuffer = Pla_ReadFile(pFileName,&pLimit);
  if (pBuffer == (char *)0x0) {
    p_00 = (Pla_Man_t *)0x0;
  }
  else {
    Pla_ReadPlaRemoveComments(pBuffer,pLimit);
    iVar1 = Pla_ReadPlaHeader(pBuffer,pLimit,&nIns,&nOuts,&local_4c,&Type);
    if (iVar1 == 0) {
      p_00 = (Pla_Man_t *)0x0;
    }
    else {
      p = Pla_ReadPlaBody(pBuffer,pLimit,Type);
      if (p->nSize % (nOuts + nIns) == 0) {
        iVar1 = p->nSize / (nOuts + nIns);
        if (local_4c != -1) {
          iVar1 = local_4c;
        }
        local_40 = p;
        p_00 = (Pla_Man_t *)calloc(1,0x98);
        pcVar2 = Extra_FileDesignName(pFileName);
        p_00->pName = pcVar2;
        if (pFileName == (char *)0x0) {
          pcVar2 = (char *)0x0;
        }
        else {
          sVar3 = strlen(pFileName);
          pcVar2 = (char *)malloc(sVar3 + 1);
          strcpy(pcVar2,pFileName);
        }
        p_00->pSpec = pcVar2;
        p_00->nIns = nIns;
        p_00->nOuts = nOuts;
        p_00->nInWords = ((nIns >> 5) + 1) - (uint)((nIns & 0x1fU) == 0);
        p_00->nOutWords = ((nOuts >> 5) + 1) - (uint)((nOuts & 0x1fU) == 0);
        Vec_IntFillNatural(&p_00->vCubes,iVar1);
        Vec_WrdFill(&p_00->vInBits,p_00->nInWords * (p_00->vCubes).nSize,Fill);
        Vec_WrdFill(&p_00->vOutBits,p_00->nOutWords * (p_00->vCubes).nSize,Fill_00);
        p = local_40;
        p_00->Type = Type;
        Pla_ReadAddBody(p_00,local_40);
      }
      else {
        p_00 = (Pla_Man_t *)0x0;
        printf("Literal count is incorrect (in = %d; out = %d; lit = %d).\n",(ulong)(uint)nIns,
               (ulong)(uint)nOuts);
      }
      Vec_StrFree(p);
    }
    free(pBuffer);
  }
  return p_00;
}

Assistant:

Pla_Man_t * Pla_ReadPla( char * pFileName )
{   
    Pla_Man_t * p;
    Vec_Str_t * vLits;
    int nIns, nOuts, nCubes, Type;
    char * pBuffer, * pLimit;   
    pBuffer = Pla_ReadFile( pFileName, &pLimit );
    if ( pBuffer == NULL )
        return NULL;
    Pla_ReadPlaRemoveComments( pBuffer, pLimit );
    if ( Pla_ReadPlaHeader( pBuffer, pLimit, &nIns, &nOuts, &nCubes, &Type ) )
    {
        vLits = Pla_ReadPlaBody( pBuffer, pLimit, (Pla_File_t)Type );
        if ( Vec_StrSize(vLits) % (nIns + nOuts) == 0 )
        {
            if ( nCubes == -1 )
                nCubes = Vec_StrSize(vLits) / (nIns + nOuts);
            p = Pla_ManAlloc( pFileName, nIns, nOuts, nCubes );
            p->Type = (Pla_File_t)Type;
            Pla_ReadAddBody( p, vLits );
            Vec_StrFree( vLits );
            ABC_FREE( pBuffer );
            return p;
        }
        printf( "Literal count is incorrect (in = %d; out = %d; lit = %d).\n", nIns, nOuts, Vec_StrSize(vLits) );
        Vec_StrFree( vLits );
    }
    ABC_FREE( pBuffer );
    return NULL;
}